

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O1

void ssh_socket_log(Plug *plug,PlugLogType type,SockAddr *addr,int port,char *error_msg,
                   int error_code)

{
  if (*(char *)&plug[0xb].vt == '\0') {
    backend_socket_log((Seat *)plug[-4].vt,(LogContext *)plug[7].vt,type,addr,port,error_msg,
                       error_code,(Conf *)plug[-3].vt,*(_Bool *)&plug[0x37].vt);
  }
  return;
}

Assistant:

static void ssh_socket_log(Plug *plug, PlugLogType type, SockAddr *addr,
                           int port, const char *error_msg, int error_code)
{
    Ssh *ssh = container_of(plug, Ssh, plug);

    /*
     * While we're attempting connection sharing, don't loudly log
     * everything that happens. Real TCP connections need to be logged
     * when we _start_ trying to connect, because it might be ages
     * before they respond if something goes wrong; but connection
     * sharing is local and quick to respond, and it's sufficient to
     * simply wait and see whether it worked afterwards.
     */

    if (!ssh->attempting_connshare)
        backend_socket_log(ssh->seat, ssh->logctx, type, addr, port,
                           error_msg, error_code, ssh->conf,
                           ssh->session_started);
}